

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.h
# Opt level: O0

void __thiscall
Js::ScriptContext::FieldAccessStatsEntry::FieldAccessStatsEntry
          (FieldAccessStatsEntry *this,RecyclerWeakReference<Js::FunctionBody> *functionBodyWeakRef,
          Recycler *recycler)

{
  Recycler *recycler_local;
  RecyclerWeakReference<Js::FunctionBody> *functionBodyWeakRef_local;
  FieldAccessStatsEntry *this_local;
  
  Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionBody>_>::WriteBarrierPtr
            (&this->functionBodyWeakRef,functionBodyWeakRef);
  SList<Js::FieldAccessStats_*,_Memory::Recycler,_RealCount>::SList(&this->stats,recycler);
  return;
}

Assistant:

FieldAccessStatsEntry(RecyclerWeakReference<FunctionBody>* functionBodyWeakRef, Recycler* recycler)
                : functionBodyWeakRef(functionBodyWeakRef), stats(recycler) {}